

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrema.c
# Opt level: O0

size_t find_maximum(uint8_t *array,size_t length)

{
  ulong local_30;
  size_t n;
  size_t sStack_20;
  uint8_t max;
  size_t res;
  size_t length_local;
  uint8_t *array_local;
  
  sStack_20 = 0;
  n._7_1_ = 0;
  for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
    if (n._7_1_ < array[local_30]) {
      n._7_1_ = array[local_30];
      sStack_20 = local_30;
    }
  }
  return sStack_20;
}

Assistant:

size_t find_maximum(const uint8_t* array, const size_t length) {
  size_t res = 0;
  uint8_t max = 0;
  for (size_t n = 0; n < length; n++) {
    if (array[n] > max) {
      max = array[n];
      res = n;
    }
  }
  return res;
}